

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O2

string * __thiscall
flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Type *type,bool element_type,bool enum_inner)

{
  BaseType BVar1;
  Enum *this_00;
  String *pSVar2;
  Object *this_01;
  undefined7 in_register_00000009;
  BaseType base_type;
  char *__s;
  string *this_02;
  string importns;
  string type_name;
  string local_48;
  
  this_02 = &importns;
  if ((int)CONCAT71(in_register_00000009,element_type) == 0) {
    BVar1 = reflection::Type::base_type(type);
  }
  else {
    BVar1 = reflection::Type::element(type);
  }
  if (BVar1 - UType < 0xc) {
    this_00 = BaseBfbsGenerator::GetEnum((BaseBfbsGenerator *)this,type,element_type);
    if (this_00 == (Enum *)0x0) {
      GenerateType_abi_cxx11_(&type_name,(void *)(ulong)BVar1,base_type);
      importns._M_dataplus._M_p = (pointer)&importns.field_2;
      importns._M_string_length = 0;
      importns.field_2._M_local_buf[0] = '\0';
      anon_unknown_0::NimBfbsGenerator::Denamespace
                (__return_storage_ptr__,(NimBfbsGenerator *)this,&type_name,&importns);
LAB_002415f7:
      std::__cxx11::string::~string((string *)&importns);
      this_02 = &type_name;
    }
    else {
      importns._M_dataplus._M_p = (pointer)&importns.field_2;
      importns._M_string_length = 0;
      importns.field_2._M_local_buf[0] = '\0';
      pSVar2 = reflection::Enum::name(this_00);
      String::str_abi_cxx11_(&local_48,pSVar2);
      anon_unknown_0::NimBfbsGenerator::Denamespace
                (&type_name,(NimBfbsGenerator *)this,&local_48,&importns);
      std::__cxx11::string::~string((string *)&local_48);
      std::operator+(&local_48,&importns,".");
      std::operator+(__return_storage_ptr__,&local_48,&type_name);
LAB_002414a8:
      std::__cxx11::string::~string((string *)&local_48);
LAB_002414b2:
      std::__cxx11::string::~string((string *)&type_name);
    }
    std::__cxx11::string::~string((string *)this_02);
  }
  else {
    switch(BVar1) {
    case String:
      __s = "string";
      break;
    case Vector:
      GenerateType_abi_cxx11_(&type_name,this,type,true,enum_inner);
      std::operator+(&importns,"seq[",&type_name);
      std::operator+(__return_storage_ptr__,&importns,"]");
      goto LAB_002415f7;
    case Obj:
      this_01 = BaseBfbsGenerator::GetObject((BaseBfbsGenerator *)this,type,element_type);
      importns._M_dataplus._M_p = (pointer)&importns.field_2;
      importns._M_string_length = 0;
      importns.field_2._M_local_buf[0] = '\0';
      pSVar2 = reflection::Object::name(this_01);
      String::str_abi_cxx11_(&local_48,pSVar2);
      anon_unknown_0::NimBfbsGenerator::Denamespace
                (&type_name,(NimBfbsGenerator *)this,&local_48,&importns);
      std::__cxx11::string::~string((string *)&local_48);
      if (this_01 != *(Object **)((long)this + 0xb8)) {
        std::operator+(&local_48,&importns,".");
        std::operator+(__return_storage_ptr__,&local_48,&type_name);
        goto LAB_002414a8;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)type_name._M_dataplus._M_p == &type_name.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(type_name.field_2._M_allocated_capacity._1_7_,
                      type_name.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = type_name.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = type_name._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(type_name.field_2._M_allocated_capacity._1_7_,
                      type_name.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = type_name._M_string_length;
      type_name._M_string_length = 0;
      type_name.field_2._M_local_buf[0] = '\0';
      type_name._M_dataplus._M_p = (pointer)&type_name.field_2;
      goto LAB_002414b2;
    case Union:
      __s = "Vtable";
      break;
    default:
      __s = "uoffset";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&importns);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateType(const r::Type *type, bool element_type = false,
                           bool enum_inner = false) const {
    const r::BaseType base_type =
        element_type ? type->element() : type->base_type();
    if (IsScalar(base_type) && !enum_inner) {
      const r::Enum *type_enum = GetEnum(type, element_type);
      if (type_enum != nullptr) {
        std::string importns;
        std::string type_name = Denamespace(type_enum->name()->str(), importns);
        return importns + "." + type_name;
      }
    }
    if (IsScalar(base_type)) { return Denamespace(GenerateType(base_type)); }
    switch (base_type) {
      case r::String: return "string";
      case r::Vector: {
        return "seq[" + GenerateType(type, true) + "]";
      }
      case r::Union: return "Vtable";
      case r::Obj: {
        const r::Object *type_obj = GetObject(type, element_type);
        std::string importns;
        std::string type_name = Denamespace(type_obj->name()->str(), importns);
        if (type_obj == current_obj_) {
          return type_name;
        } else {
          return importns + "." + type_name;
        }
      }
      default: return "uoffset";
    }
  }